

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O1

void __thiscall Exttpose::process_cust(Exttpose *this,int fcnt,fstream *seqfd,fstream *isetfd)

{
  pointer puVar1;
  fstream *pfVar2;
  uint uVar3;
  uint uVar4;
  pointer pTVar5;
  pointer piVar6;
  uint uVar7;
  pointer pTVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  
  if (0 < fcnt) {
    pfVar2 = seqfd + 0x10;
    uVar12 = 0;
    uVar11 = uVar12;
    do {
      do {
        if (this->args->use_seq != 0) {
          pTVar5 = (this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          piVar6 = (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar9 = (long)piVar6[uVar12];
          if ((0 < pTVar5[lVar9].theSize) &&
             (lVar13 = (long)piVar6[uVar11],
             **(int **)&pTVar5[lVar13].theArray.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl <
             *(int *)(*(long *)&pTVar5[lVar9].theArray.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl + (ulong)(pTVar5[lVar9].theSize - 1) * 4))) {
            puVar1 = (this->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar9 + lVar13 * this->numfreq;
            *puVar1 = *puVar1 + '\x01';
            if (*puVar1 == '\0') {
              std::ostream::write((char *)pfVar2,
                                  (long)((this->backidx).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start +
                                        (this->fidx).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar11]));
              std::ostream::write((char *)pfVar2,
                                  (long)((this->backidx).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start +
                                        (this->fidx).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar12]));
            }
          }
        }
        if (uVar11 < uVar12) {
          piVar6 = (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar3 = piVar6[uVar11];
          uVar4 = piVar6[uVar12];
          uVar7 = uVar4;
          if ((int)uVar3 < (int)uVar4) {
            uVar7 = uVar3;
          }
          if ((int)uVar4 < (int)uVar3) {
            uVar4 = uVar3;
          }
          iVar10 = ~uVar7 + uVar4 +
                   (this->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar7];
          if ((this->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[iVar10] == '\x01') {
            puVar1 = (this->itcnt2).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start + iVar10;
            *puVar1 = *puVar1 + '\x01';
            if (*puVar1 == '\0') {
              std::ostream::write((char *)(isetfd + 0x10),
                                  (long)((this->backidx).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + (int)uVar7));
              std::ostream::write((char *)(isetfd + 0x10),
                                  (long)((this->backidx).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start + (int)uVar4));
            }
            (this->ocust).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[iVar10] = '\0';
          }
          pTVar5 = (this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          piVar6 = (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar9 = (long)piVar6[uVar11];
          if ((0 < pTVar5[lVar9].theSize) &&
             (lVar13 = (long)piVar6[uVar12],
             **(int **)&pTVar5[lVar13].theArray.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl <
             *(int *)(*(long *)&pTVar5[lVar9].theArray.super__Vector_base<int,_std::allocator<int>_>
                                ._M_impl + (ulong)(pTVar5[lVar9].theSize - 1) * 4))) {
            puVar1 = (this->seq2).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar9 + lVar13 * this->numfreq;
            *puVar1 = *puVar1 + '\x01';
            if (*puVar1 == '\0') {
              std::ostream::write((char *)pfVar2,
                                  (long)((this->backidx).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start +
                                        (this->fidx).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar12]));
              std::ostream::write((char *)pfVar2,
                                  (long)((this->backidx).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start +
                                        (this->fidx).super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar11]));
            }
          }
        }
        uVar12 = uVar12 + 1;
      } while ((uint)fcnt != uVar12);
      pTVar5 = (this->extary).super__Vector_base<TransArray,_std::allocator<TransArray>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar10 = (this->fidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar11];
      pTVar8 = pTVar5 + iVar10;
      pTVar8->lastPos = 0;
      pTVar8->theSize = 0;
      pTVar5[iVar10].theFlg = '\0';
      uVar12 = uVar11 + 1;
      uVar11 = uVar12;
    } while (uVar12 != (uint)fcnt);
  }
  return;
}

Assistant:

void Exttpose::process_cust(int fcnt, fstream &seqfd, fstream &isetfd) {
    int j, k;
    int ii1, ii2, lit;

    for (k = 0; k < fcnt; k++) {
        for (j = k; j < fcnt; j++) {
            if (args.use_seq && extary[fidx[j]].size() > 0) {
                lit = extary[fidx[j]].size() - 1;
                if (extary[fidx[k]][0] < extary[fidx[j]][lit]) {
                    if ((++seq2[fidx[k] * numfreq + fidx[j]]) == 0) {
                        seqfd.write((char *) &backidx[fidx[k]], INT_SIZE);
                        seqfd.write((char *) &backidx[fidx[j]], INT_SIZE);
                    }
                }
            }
            if (j > k) {
                if (fidx[k] < fidx[j]) {
                    ii1 = fidx[k];
                    ii2 = fidx[j];
                } else {
                    ii2 = fidx[k];
                    ii1 = fidx[j];
                }
                lit = offsets[ii1] - ii1 - 1;
                if (ocust[lit + ii2] == 1) {
                    if ((++itcnt2[lit + ii2]) == 0) {
                        isetfd.write((char *) &backidx[ii1], INT_SIZE);
                        isetfd.write((char *) &backidx[ii2], INT_SIZE);
                        //itcnt2[lit+ii2] = 0;
                    }
                    ocust[lit + ii2] = 0;
                }

                if (extary[fidx[k]].size() > 0) {
                    lit = extary[fidx[k]].size() - 1;
                    if (extary[fidx[j]][0] < extary[fidx[k]][lit]) {
                        if ((++seq2[fidx[j] * numfreq + fidx[k]]) == 0) {
                            seqfd.write((char *) &backidx[fidx[j]], INT_SIZE);
                            seqfd.write((char *) &backidx[fidx[k]], INT_SIZE);
                        }
                    }
                }
            }
        }
        extary[fidx[k]].reset();
    }
}